

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascRootFile_MNDX.cpp
# Opt level: O0

void __thiscall TStruct40::BeginSearch(TStruct40 *this)

{
  TStruct40 *this_local;
  
  (this->PathBuffer).ItemCount = 0;
  TGenericArray<char>::SetMaxItemsIf(&this->PathBuffer,0x40);
  TGenericArray<TPathStop>::GrowArray(&this->PathStops,0);
  TGenericArray<TPathStop>::SetMaxItemsIf(&this->PathStops,4);
  this->PathLength = 0;
  this->NodeIndex = 0;
  this->ItemCount = 0;
  this->SearchPhase = 2;
  return;
}

Assistant:

void BeginSearch()
    {
        // HOTS: 19586BD
        PathBuffer.ItemCount = 0;
        PathBuffer.SetMaxItemsIf(0x40);

        // HOTS: 19586E1
        // Set the new item count
        PathStops.GrowArray(0);
        PathStops.SetMaxItemsIf(4);

        PathLength = 0;
        NodeIndex = 0;
        ItemCount = 0;
        SearchPhase = MNDX_SEARCH_SEARCHING;
    }